

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_spec_tests.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  UnitTestSource *pUVar5;
  char **in_R9;
  AssertionResult iutest_ar_1;
  AssertionResult iutest_ar;
  int targc;
  pointer local_368 [49];
  AssertionReturnType<int> local_1e0;
  char *targv [2];
  iuStreamMessage local_1b8;
  
  iutest::detail::iuConsole::GetLoggerInstanceVariable()::sLogger = &logger;
  targc = 2;
  targv[0] = *argv;
  targv[1] = "--feature";
  iutest::detail::InitIrisUnitTest<char_const**>(&targc,targv);
  iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x4000000);
  paVar1 = &iutest_ar.m_message.field_2;
  iutest_ar.m_message._M_string_length = 0;
  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
  iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
  if (!iutest_ar.m_result) {
    memset((iu_global_format_stringstream *)local_368,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_368);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&iutest_ar_1.m_message,(internal *)&iutest_ar,
               (AssertionResult *)
               "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)","false","true",
               (char *)in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
               ,0x32,iutest_ar_1.m_message._M_dataplus._M_p);
    local_1b8.m_stream.super_iu_stringstream._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1b8,(Fixed *)local_368);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&iutest_ar_1);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_368);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  logger.m_log._M_string_length = 0;
  *logger.m_log._M_dataplus._M_p = '\0';
  pUVar5 = iutest::UnitTestSource::GetInstance();
  iVar3 = iutest::UnitTestSource::Run(pUVar5);
  local_368[0] = logger.m_log._M_dataplus._M_p;
  iuutil::StrInHelper::Assertion<char[24],char_const*>
            (&iutest_ar_1,(StrInHelper *)"\"IUTEST_HAS_TYPED_TEST_P\"","logger.c_str()",
             "IUTEST_HAS_TYPED_TEST_P",(char (*) [24])local_368,in_R9);
  bVar2 = iutest_ar_1.m_result;
  iVar4 = 0;
  if (iutest_ar_1.m_result == false) {
    memset(&local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
    iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)local_368,&local_1b8);
    local_1e0.value = 1;
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_ar,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
               ,0x36,iutest_ar_1.m_message._M_dataplus._M_p);
    iVar4 = iutest::AssertionHelper::operator=
                      ((AssertionHelper *)&iutest_ar,(ReturnTypedFixed<int> *)local_368);
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_368);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream);
  }
  std::__cxx11::string::~string((string *)&iutest_ar_1);
  if (bVar2 != false) {
    local_368[0] = logger.m_log._M_dataplus._M_p;
    iuutil::StrNotInHelper::Assertion<char[17],char_const*>
              (&iutest_ar_1,(StrNotInHelper *)"\"IUTEST_HAS_TUPLE\"","logger.c_str()",
               "IUTEST_HAS_TUPLE",(char (*) [17])local_368,in_R9);
    bVar2 = iutest_ar_1.m_result;
    if (iutest_ar_1.m_result == false) {
      memset(&local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
      iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)local_368,&local_1b8);
      local_1e0.value = 1;
      iutest::detail::iuCodeMessage::iuCodeMessage
                ((iuCodeMessage *)&iutest_ar,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                 ,0x37,iutest_ar_1.m_message._M_dataplus._M_p);
      iVar4 = iutest::AssertionHelper::operator=
                        ((AssertionHelper *)&iutest_ar,(ReturnTypedFixed<int> *)local_368);
      std::__cxx11::string::~string((string *)&iutest_ar);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_368);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar_1);
    if (bVar2 != false) {
      if (iVar3 == 0) {
        targc = 2;
        targv[0] = *argv;
        targv[1] = "--spec";
        iutest::detail::InitIrisUnitTest<char_const**>(&targc,targv);
        iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x8000000);
        iutest_ar.m_message._M_string_length = 0;
        iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
        iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
        if (!iutest_ar.m_result) {
          memset((iu_global_format_stringstream *)local_368,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_368);
          iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                    (&iutest_ar_1.m_message,(internal *)&iutest_ar,
                     (AssertionResult *)
                     "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC)","false",
                     "true",(char *)in_R9);
          iutest::detail::iuCodeMessage::iuCodeMessage
                    ((iuCodeMessage *)&local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                     ,0x40,iutest_ar_1.m_message._M_dataplus._M_p);
          local_1b8.m_stream.super_iu_stringstream._44_4_ = 1;
          iutest::AssertionHelper::operator=((AssertionHelper *)&local_1b8,(Fixed *)local_368);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&iutest_ar_1);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_368);
        }
        std::__cxx11::string::~string((string *)&iutest_ar);
        logger.m_log._M_string_length = 0;
        *logger.m_log._M_dataplus._M_p = '\0';
        pUVar5 = iutest::UnitTestSource::GetInstance();
        iVar3 = iutest::UnitTestSource::Run(pUVar5);
        local_368[0] = logger.m_log._M_dataplus._M_p;
        iuutil::StrNotInHelper::Assertion<char[24],char_const*>
                  (&iutest_ar_1,(StrNotInHelper *)"\"IUTEST_HAS_TYPED_TEST_P\"","logger.c_str()",
                   "IUTEST_HAS_TYPED_TEST_P",(char (*) [24])local_368,in_R9);
        bVar2 = iutest_ar_1.m_result;
        if (iutest_ar_1.m_result == false) {
          memset(&local_1b8,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
          iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)local_368,&local_1b8);
          local_1e0.value = 1;
          iutest::detail::iuCodeMessage::iuCodeMessage
                    ((iuCodeMessage *)&iutest_ar,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                     ,0x44,iutest_ar_1.m_message._M_dataplus._M_p);
          iVar4 = iutest::AssertionHelper::operator=
                            ((AssertionHelper *)&iutest_ar,(ReturnTypedFixed<int> *)local_368);
          std::__cxx11::string::~string((string *)&iutest_ar);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_368);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream)
          ;
        }
        std::__cxx11::string::~string((string *)&iutest_ar_1);
        if (bVar2 == false) {
          return iVar4;
        }
        local_368[0] = logger.m_log._M_dataplus._M_p;
        iuutil::StrInHelper::Assertion<char[17],char_const*>
                  (&iutest_ar_1,(StrInHelper *)"\"IUTEST_HAS_TUPLE\"","logger.c_str()",
                   "IUTEST_HAS_TUPLE",(char (*) [17])local_368,in_R9);
        bVar2 = iutest_ar_1.m_result;
        if (iutest_ar_1.m_result == false) {
          memset(&local_1b8,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
          iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)local_368,&local_1b8);
          local_1e0.value = 1;
          iutest::detail::iuCodeMessage::iuCodeMessage
                    ((iuCodeMessage *)&iutest_ar,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                     ,0x45,iutest_ar_1.m_message._M_dataplus._M_p);
          iVar4 = iutest::AssertionHelper::operator=
                            ((AssertionHelper *)&iutest_ar,(ReturnTypedFixed<int> *)local_368);
          std::__cxx11::string::~string((string *)&iutest_ar);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_368);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream)
          ;
        }
        std::__cxx11::string::~string((string *)&iutest_ar_1);
        if (bVar2 == false) {
          return iVar4;
        }
        if (iVar3 == 0) {
          targc = 3;
          targv[0] = *argv;
          targv[1] = "--feature";
          iutest::detail::InitIrisUnitTest<char_const**>(&targc,targv);
          iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x4000000);
          iutest_ar.m_message._M_string_length = 0;
          iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
          iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
          if (!iutest_ar.m_result) {
            memset((iu_global_format_stringstream *)local_368,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_368);
            iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                      (&iutest_ar_1.m_message,(internal *)&iutest_ar,
                       (AssertionResult *)
                       "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)","false",
                       "true",(char *)in_R9);
            iutest::detail::iuCodeMessage::iuCodeMessage
                      ((iuCodeMessage *)&local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                       ,0x4e,iutest_ar_1.m_message._M_dataplus._M_p);
            local_1b8.m_stream.super_iu_stringstream._44_4_ = 1;
            iutest::AssertionHelper::operator=((AssertionHelper *)&local_1b8,(Fixed *)local_368);
            std::__cxx11::string::~string((string *)&local_1b8);
            std::__cxx11::string::~string((string *)&iutest_ar_1);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_368);
          }
          std::__cxx11::string::~string((string *)&iutest_ar);
          iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x8000000);
          iutest_ar.m_message._M_string_length = 0;
          iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
          iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
          if (!iutest_ar.m_result) {
            memset((iu_global_format_stringstream *)local_368,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_368);
            iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                      (&iutest_ar_1.m_message,(internal *)&iutest_ar,
                       (AssertionResult *)
                       "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC)","false",
                       "true",(char *)in_R9);
            iutest::detail::iuCodeMessage::iuCodeMessage
                      ((iuCodeMessage *)&local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                       ,0x4f,iutest_ar_1.m_message._M_dataplus._M_p);
            local_1b8.m_stream.super_iu_stringstream._44_4_ = 1;
            iutest::AssertionHelper::operator=((AssertionHelper *)&local_1b8,(Fixed *)local_368);
            std::__cxx11::string::~string((string *)&local_1b8);
            std::__cxx11::string::~string((string *)&iutest_ar_1);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_368);
          }
          std::__cxx11::string::~string((string *)&iutest_ar);
          logger.m_log._M_string_length = 0;
          *logger.m_log._M_dataplus._M_p = '\0';
          pUVar5 = iutest::UnitTestSource::GetInstance();
          iVar3 = iutest::UnitTestSource::Run(pUVar5);
          local_368[0] = logger.m_log._M_dataplus._M_p;
          iuutil::StrInHelper::Assertion<char[24],char_const*>
                    (&iutest_ar_1,(StrInHelper *)"\"IUTEST_HAS_TYPED_TEST_P\"","logger.c_str()",
                     "IUTEST_HAS_TYPED_TEST_P",(char (*) [24])local_368,in_R9);
          bVar2 = iutest_ar_1.m_result;
          if (iutest_ar_1.m_result == false) {
            memset(&local_1b8,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      (&local_1b8.m_stream);
            iutest::detail::iuStreamMessage::iuStreamMessage
                      ((iuStreamMessage *)local_368,&local_1b8);
            local_1e0.value = 1;
            iutest::detail::iuCodeMessage::iuCodeMessage
                      ((iuCodeMessage *)&iutest_ar,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                       ,0x53,iutest_ar_1.m_message._M_dataplus._M_p);
            iVar4 = iutest::AssertionHelper::operator=
                              ((AssertionHelper *)&iutest_ar,(ReturnTypedFixed<int> *)local_368);
            std::__cxx11::string::~string((string *)&iutest_ar);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_368);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      (&local_1b8.m_stream);
          }
          std::__cxx11::string::~string((string *)&iutest_ar_1);
          if (bVar2 == false) {
            return iVar4;
          }
          local_368[0] = logger.m_log._M_dataplus._M_p;
          iuutil::StrInHelper::Assertion<char[17],char_const*>
                    (&iutest_ar_1,(StrInHelper *)"\"IUTEST_HAS_TUPLE\"","logger.c_str()",
                     "IUTEST_HAS_TUPLE",(char (*) [17])local_368,in_R9);
          if (iutest_ar_1.m_result == false) {
            memset(&local_1b8,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      (&local_1b8.m_stream);
            iutest::detail::iuStreamMessage::iuStreamMessage
                      ((iuStreamMessage *)local_368,&local_1b8);
            local_1e0.value = 1;
            iutest::detail::iuCodeMessage::iuCodeMessage
                      ((iuCodeMessage *)&iutest_ar,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                       ,0x54,iutest_ar_1.m_message._M_dataplus._M_p);
            iVar4 = iutest::AssertionHelper::operator=
                              ((AssertionHelper *)&iutest_ar,(ReturnTypedFixed<int> *)local_368);
            std::__cxx11::string::~string((string *)&iutest_ar);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_368);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      (&local_1b8.m_stream);
          }
          std::__cxx11::string::~string((string *)&iutest_ar_1);
          if (iutest_ar_1.m_result == false) {
            return iVar4;
          }
          if (iVar3 == 0) {
            puts("*** Successful ***");
            return 0;
          }
        }
      }
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    (void)argc;
    (void)argv;
#if !defined(IUTEST_USE_GTEST)
    ::iutest::detail::iuConsole::SetLogger(&logger);

    {
        int targc = 2;
        DECAL_ARGV("--feature");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRIN   ("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRNOTIN("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }

    {
        int targc = 2;
        DECAL_ARGV("--spec");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRNOTIN("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRIN   ("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }

    {
        int targc = 3;
        DECAL_ARGV2("--feature", "--spec");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRIN("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRIN("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}